

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::GLSLContantValuesTest::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,GLSLContantValuesTest *this,GLuint param_1,
          ProgramInterface *param_2,STAGES stage)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  char local_78 [8];
  GLchar buffer [16];
  size_t local_60;
  size_t position;
  undefined1 local_41;
  uint local_40;
  uint local_3c;
  GLint max_transform_feedback_interleaved_components;
  GLint max_transform_feedback_buffers;
  Functions *gl;
  ProgramInterface *pPStack_28;
  STAGES stage_local;
  ProgramInterface *param_2_local;
  GLSLContantValuesTest *pGStack_18;
  GLuint param_1_local;
  GLSLContantValuesTest *this_local;
  string *verification;
  
  gl._4_4_ = stage;
  pPStack_28 = param_2;
  param_2_local._4_4_ = param_1;
  pGStack_18 = this;
  this_local = (GLSLContantValuesTest *)__return_storage_ptr__;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _max_transform_feedback_interleaved_components = CONCAT44(extraout_var,iVar1);
  local_3c = 0;
  local_40 = 0;
  (**(code **)(_max_transform_feedback_interleaved_components + 0x868))(0x8e70,&local_3c);
  dVar2 = (**(code **)(_max_transform_feedback_interleaved_components + 0x800))();
  glu::checkError(dVar2,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2042);
  (**(code **)(_max_transform_feedback_interleaved_components + 0x868))(0x8c8a,&local_40);
  dVar2 = (**(code **)(_max_transform_feedback_interleaved_components + 0x800))();
  glu::checkError(dVar2,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2044);
  local_41 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (gl._4_4_ == VERTEX) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "if (1 != GL_ARB_enhanced_layouts)\n    {\n        result = 0;\n    }\n    else if (MAX_TRANSFORM_FEEDBACK_BUFFERS\n        != gl_MaxTransformFeedbackBuffers)\n    {\n        result = 0;\n    }\n    else if (MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS \n        != gl_MaxTransformFeedbackInterleavedComponents)\n    {\n        result = 0;\n    }\n"
              );
    local_60 = 0;
    sprintf(local_78,"%d",(ulong)local_3c);
    Utils::replaceToken("MAX_TRANSFORM_FEEDBACK_BUFFERS",&local_60,local_78,__return_storage_ptr__);
    sprintf(local_78,"%d",(ulong)local_40);
    Utils::replaceToken("MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS",&local_60,local_78,
                        __return_storage_ptr__);
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GLSLContantValuesTest::getVerificationSnippet(GLuint /* test_case_index */,
														  Utils::ProgramInterface& /* program_interface */,
														  Utils::Shader::STAGES stage)
{
	/* Get constants */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLint max_transform_feedback_buffers				= 0;
	GLint max_transform_feedback_interleaved_components = 0;

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_BUFFERS, &max_transform_feedback_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS, &max_transform_feedback_interleaved_components);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::string verification;

	if (Utils::Shader::VERTEX == stage)
	{
		verification = "if (1 != GL_ARB_enhanced_layouts)\n"
					   "    {\n"
					   "        result = 0;\n"
					   "    }\n"
					   "    else if (MAX_TRANSFORM_FEEDBACK_BUFFERS\n"
					   "        != gl_MaxTransformFeedbackBuffers)\n"
					   "    {\n"
					   "        result = 0;\n"
					   "    }\n"
					   "    else if (MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS \n"
					   "        != gl_MaxTransformFeedbackInterleavedComponents)\n"
					   "    {\n"
					   "        result = 0;\n"
					   "    }\n";

		size_t position = 0;
		GLchar buffer[16];

		sprintf(buffer, "%d", max_transform_feedback_buffers);
		Utils::replaceToken("MAX_TRANSFORM_FEEDBACK_BUFFERS", position, buffer, verification);

		sprintf(buffer, "%d", max_transform_feedback_interleaved_components);
		Utils::replaceToken("MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS", position, buffer, verification);
	}
	else
	{
		verification = "";
	}

	return verification;
}